

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_bspline.cpp
# Opt level: O1

double __thiscall agg::bspline::extrapolation_right(bspline *this,double x)

{
  double dVar1;
  double *pdVar2;
  long lVar3;
  
  lVar3 = (long)this->m_num;
  pdVar2 = this->m_x;
  dVar1 = this->m_y[lVar3 + -1];
  return (x - pdVar2[lVar3 + -1]) *
         ((dVar1 - this->m_y[lVar3 + -2]) / (pdVar2[lVar3 + -1] - pdVar2[lVar3 + -2]) +
         ((this->m_am).m_array[lVar3 - 2U & 0xffffffff] * (pdVar2[lVar3 + -1] - pdVar2[lVar3 + -2]))
         / 6.0) + dVar1;
}

Assistant:

double bspline::extrapolation_right(double x) const
    {
        double d = m_x[m_num - 1] - m_x[m_num - 2];
        return (d * m_am[m_num - 2] / 6 + (m_y[m_num - 1] - m_y[m_num - 2]) / d) * 
               (x - m_x[m_num - 1]) + 
               m_y[m_num - 1];
    }